

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_realpath(void)

{
  undefined8 uVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar3;
  int extraout_EAX_01;
  uv_loop_t *puVar4;
  size_t sVar5;
  uv_loop_t *unaff_RBX;
  uv_loop_t *puVar6;
  char *pcVar7;
  int iVar8;
  uv_fs_t *req_00;
  uv_buf_t uVar9;
  uv_fs_t req;
  size_t asStackY_de8 [3];
  uv_fs_t uStackY_dd0;
  uv_loop_t *puStackY_c18;
  size_t sStackY_be0;
  char acStackY_bd8 [7];
  undefined4 auStackY_bd1 [256];
  uv_loop_t *puStackY_7d0;
  uv_fs_t *puStackY_7c8;
  uv_loop_t *puStackY_7c0;
  code *pcStackY_7b8;
  size_t sStack_7a0;
  undefined1 auStack_798 [447];
  undefined4 auStack_5d9 [256];
  uv_loop_t *puStack_1d8;
  void *local_168;
  void *local_160;
  
  loop = uv_default_loop();
  iVar2 = uv_fs_realpath(loop,(uv_fs_t *)&stack0xfffffffffffffe40,"no_such_file",dummy_cb);
  if (iVar2 == 0) {
    iVar2 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0015381b;
    if (dummy_cb_count != 1) goto LAB_00153820;
    if (local_160 != (void *)0x0) goto LAB_00153825;
    if (local_168 != (void *)0xfffffffffffffffe) goto LAB_0015382a;
    unaff_RBX = (uv_loop_t *)&stack0xfffffffffffffe40;
    uv_fs_req_cleanup((uv_fs_t *)unaff_RBX);
    iVar2 = uv_fs_realpath((uv_loop_t *)0x0,(uv_fs_t *)unaff_RBX,"no_such_file",(uv_fs_cb)0x0);
    if (iVar2 != -2) goto LAB_0015382f;
    if (local_160 != (void *)0x0) goto LAB_00153834;
    if (local_168 != (void *)0xfffffffffffffffe) goto LAB_00153839;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe40);
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_realpath_cold_1();
LAB_0015381b:
    run_test_fs_realpath_cold_2();
LAB_00153820:
    run_test_fs_realpath_cold_3();
LAB_00153825:
    run_test_fs_realpath_cold_4();
LAB_0015382a:
    run_test_fs_realpath_cold_5();
LAB_0015382f:
    run_test_fs_realpath_cold_6();
LAB_00153834:
    run_test_fs_realpath_cold_7();
LAB_00153839:
    run_test_fs_realpath_cold_8();
  }
  run_test_fs_realpath_cold_9();
  puVar4 = (uv_loop_t *)0x194385;
  pcStackY_7b8 = (code *)0x15385c;
  puStack_1d8 = unaff_RBX;
  unlink("test_file");
  pcStackY_7b8 = (code *)0x153868;
  unlink("test_file_symlink");
  pcStackY_7b8 = (code *)0x153874;
  unlink("test_file_symlink2");
  pcStackY_7b8 = (code *)0x153880;
  unlink("test_file_symlink_symlink");
  pcStackY_7b8 = (code *)0x15388c;
  unlink("test_file_symlink2_symlink");
  sStack_7a0 = 0x400;
  req_00 = (uv_fs_t *)(auStack_798 + 0x1b8);
  pcStackY_7b8 = (code *)0x1538a8;
  uv_cwd((char *)req_00,&sStack_7a0);
  pcStackY_7b8 = (code *)0x1538b0;
  sVar5 = strlen((char *)req_00);
  *(undefined8 *)(auStack_798 + sVar5 + 0x1b8) = 0x69665f747365742f;
  *(undefined4 *)((long)auStack_5d9 + sVar5) = 0x656c69;
  pcStackY_7b8 = (code *)0x1538d2;
  loop = uv_default_loop();
  pcVar7 = (char *)0x0;
  pcStackY_7b8 = (code *)0x1538f6;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_798,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar1 = auStack_798._88_8_;
  if (iVar2 < 0) {
    pcStackY_7b8 = (code *)0x153dd3;
    run_test_fs_symlink_cold_1();
LAB_00153dd3:
    pcStackY_7b8 = (code *)0x153dd8;
    run_test_fs_symlink_cold_2();
LAB_00153dd8:
    pcStackY_7b8 = (code *)0x153ddd;
    run_test_fs_symlink_cold_3();
LAB_00153ddd:
    pcStackY_7b8 = (code *)0x153de2;
    run_test_fs_symlink_cold_4();
LAB_00153de2:
    pcStackY_7b8 = (code *)0x153de7;
    run_test_fs_symlink_cold_5();
LAB_00153de7:
    pcStackY_7b8 = (code *)0x153dec;
    run_test_fs_symlink_cold_6();
LAB_00153dec:
    puVar6 = puVar4;
    pcStackY_7b8 = (code *)0x153df1;
    run_test_fs_symlink_cold_7();
LAB_00153df1:
    pcStackY_7b8 = (code *)0x153df6;
    run_test_fs_symlink_cold_8();
LAB_00153df6:
    pcStackY_7b8 = (code *)0x153dfb;
    run_test_fs_symlink_cold_9();
LAB_00153dfb:
    pcStackY_7b8 = (code *)0x153e00;
    run_test_fs_symlink_cold_10();
LAB_00153e00:
    pcStackY_7b8 = (code *)0x153e05;
    run_test_fs_symlink_cold_11();
LAB_00153e05:
    pcStackY_7b8 = (code *)0x153e0a;
    run_test_fs_symlink_cold_12();
LAB_00153e0a:
    pcStackY_7b8 = (code *)0x153e0f;
    run_test_fs_symlink_cold_13();
LAB_00153e0f:
    pcStackY_7b8 = (code *)0x153e14;
    run_test_fs_symlink_cold_14();
LAB_00153e14:
    pcStackY_7b8 = (code *)0x153e19;
    run_test_fs_symlink_cold_15();
LAB_00153e19:
    pcStackY_7b8 = (code *)0x153e1e;
    run_test_fs_symlink_cold_16();
LAB_00153e1e:
    pcStackY_7b8 = (code *)0x153e23;
    run_test_fs_symlink_cold_17();
LAB_00153e23:
    pcStackY_7b8 = (code *)0x153e28;
    run_test_fs_symlink_cold_18();
LAB_00153e28:
    puVar4 = puVar6;
    pcStackY_7b8 = (code *)0x153e2d;
    run_test_fs_symlink_cold_19();
LAB_00153e2d:
    pcStackY_7b8 = (code *)0x153e32;
    run_test_fs_symlink_cold_20();
LAB_00153e32:
    pcStackY_7b8 = (code *)0x153e37;
    run_test_fs_symlink_cold_21();
LAB_00153e37:
    pcStackY_7b8 = (code *)0x153e3c;
    run_test_fs_symlink_cold_22();
LAB_00153e3c:
    pcStackY_7b8 = (code *)0x153e41;
    run_test_fs_symlink_cold_23();
LAB_00153e41:
    pcStackY_7b8 = (code *)0x153e46;
    run_test_fs_symlink_cold_24();
LAB_00153e46:
    pcStackY_7b8 = (code *)0x153e4b;
    run_test_fs_symlink_cold_25();
LAB_00153e4b:
    pcStackY_7b8 = (code *)0x153e50;
    run_test_fs_symlink_cold_26();
LAB_00153e50:
    pcStackY_7b8 = (code *)0x153e55;
    run_test_fs_symlink_cold_27();
LAB_00153e55:
    pcStackY_7b8 = (code *)0x153e5a;
    run_test_fs_symlink_cold_28();
  }
  else {
    puVar4 = (uv_loop_t *)auStack_798._88_8_;
    if ((long)auStack_798._88_8_ < 0) goto LAB_00153dd3;
    req_00 = (uv_fs_t *)auStack_798;
    pcStackY_7b8 = (code *)0x153919;
    uv_fs_req_cleanup(req_00);
    pcStackY_7b8 = (code *)0x15392a;
    iov = uv_buf_init(test_buf,0xd);
    pcVar7 = (char *)0x0;
    pcStackY_7b8 = (code *)0x153960;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,req_00,(uv_file)uVar1,&iov,1,-1,(uv_fs_cb)0x0);
    puVar4 = (uv_loop_t *)uVar1;
    if (iVar2 != 0xd) goto LAB_00153dd8;
    if ((uv_loop_t *)auStack_798._88_8_ != (uv_loop_t *)0xd) goto LAB_00153ddd;
    req_00 = (uv_fs_t *)auStack_798;
    pcStackY_7b8 = (code *)0x153982;
    uv_fs_req_cleanup(req_00);
    pcStackY_7b8 = (code *)0x153995;
    uv_fs_close(loop,req_00,(uv_file)uVar1,(uv_fs_cb)0x0);
    pcVar7 = (char *)0x0;
    pcStackY_7b8 = (code *)0x1539b3;
    iVar2 = uv_fs_symlink((uv_loop_t *)0x0,req_00,"test_file","test_file_symlink",0,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00153de2;
    if ((uv_loop_t *)auStack_798._88_8_ != (uv_loop_t *)0x0) goto LAB_00153de7;
    pcStackY_7b8 = (code *)0x1539d4;
    uv_fs_req_cleanup((uv_fs_t *)auStack_798);
    pcVar7 = (char *)0x0;
    pcStackY_7b8 = (code *)0x1539f0;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_798,"test_file_symlink",2,0,(uv_fs_cb)0x0
                      );
    puVar6 = (uv_loop_t *)auStack_798._88_8_;
    puVar4 = (uv_loop_t *)auStack_798;
    if (iVar2 < 0) goto LAB_00153dec;
    if ((long)auStack_798._88_8_ < 0) goto LAB_00153df1;
    req_00 = (uv_fs_t *)auStack_798;
    pcStackY_7b8 = (code *)0x153a13;
    uv_fs_req_cleanup(req_00);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_7b8 = (code *)0x153a35;
    uVar9 = uv_buf_init(buf,0x20);
    pcVar7 = (char *)0x0;
    pcStackY_7b8 = (code *)0x153a67;
    iov = uVar9;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,req_00,(uv_file)puVar6,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00153df6;
    if ((long)auStack_798._88_8_ < 0) goto LAB_00153dfb;
    pcVar7 = buf;
    pcStackY_7b8 = (code *)0x153a8e;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00153e00;
    req_00 = (uv_fs_t *)auStack_798;
    pcStackY_7b8 = (code *)0x153aae;
    uv_fs_close(loop,req_00,(uv_file)puVar6,(uv_fs_cb)0x0);
    pcVar7 = (char *)0x0;
    pcStackY_7b8 = (code *)0x153acc;
    iVar2 = uv_fs_symlink((uv_loop_t *)0x0,req_00,"test_file_symlink","test_file_symlink_symlink",0,
                          (uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00153e05;
    puVar6 = (uv_loop_t *)auStack_798;
    pcStackY_7b8 = (code *)0x153ae1;
    uv_fs_req_cleanup((uv_fs_t *)puVar6);
    pcVar7 = (char *)0x0;
    pcStackY_7b8 = (code *)0x153af4;
    iVar2 = uv_fs_readlink((uv_loop_t *)0x0,(uv_fs_t *)puVar6,"test_file_symlink_symlink",
                           (uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00153e0a;
    pcStackY_7b8 = (code *)0x153b0d;
    pcVar7 = (char *)auStack_798._96_8_;
    iVar2 = strcmp((char *)auStack_798._96_8_,"test_file_symlink");
    if (iVar2 != 0) goto LAB_00153e0f;
    puVar6 = (uv_loop_t *)auStack_798;
    pcStackY_7b8 = (code *)0x153b22;
    uv_fs_req_cleanup((uv_fs_t *)puVar6);
    pcVar7 = (char *)0x0;
    pcStackY_7b8 = (code *)0x153b35;
    iVar2 = uv_fs_realpath((uv_loop_t *)0x0,(uv_fs_t *)puVar6,"test_file_symlink_symlink",
                           (uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00153e14;
    pcStackY_7b8 = (code *)0x153b4f;
    iVar2 = strcmp((char *)auStack_798._96_8_,auStack_798 + 0x1b8);
    pcVar7 = (char *)auStack_798._96_8_;
    if (iVar2 != 0) goto LAB_00153e19;
    puVar6 = (uv_loop_t *)auStack_798;
    pcStackY_7b8 = (code *)0x153b64;
    uv_fs_req_cleanup((uv_fs_t *)puVar6);
    pcStackY_7b8 = (code *)0x153b8b;
    pcVar7 = (char *)loop;
    iVar2 = uv_fs_symlink(loop,(uv_fs_t *)puVar6,"test_file","test_file_symlink2",0,symlink_cb);
    if (iVar2 != 0) goto LAB_00153e1e;
    pcStackY_7b8 = (code *)0x153ba1;
    pcVar7 = (char *)loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (symlink_cb_count != 1) goto LAB_00153e23;
    pcVar7 = (char *)0x0;
    pcStackY_7b8 = (code *)0x153bcc;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_798,"test_file_symlink2",2,0,
                       (uv_fs_cb)0x0);
    puVar4 = (uv_loop_t *)auStack_798._88_8_;
    if (iVar2 < 0) goto LAB_00153e28;
    if ((long)auStack_798._88_8_ < 0) goto LAB_00153e2d;
    req_00 = (uv_fs_t *)auStack_798;
    pcStackY_7b8 = (code *)0x153bef;
    uv_fs_req_cleanup(req_00);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_7b8 = (code *)0x153c11;
    uVar9 = uv_buf_init(buf,0x20);
    pcVar7 = (char *)0x0;
    pcStackY_7b8 = (code *)0x153c43;
    iov = uVar9;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,req_00,(uv_file)puVar4,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00153e32;
    if ((long)auStack_798._88_8_ < 0) goto LAB_00153e37;
    pcVar7 = buf;
    pcStackY_7b8 = (code *)0x153c6a;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00153e3c;
    req_00 = (uv_fs_t *)auStack_798;
    pcStackY_7b8 = (code *)0x153c8a;
    uv_fs_close(loop,req_00,(uv_file)puVar4,(uv_fs_cb)0x0);
    pcVar7 = (char *)0x0;
    pcStackY_7b8 = (code *)0x153ca8;
    iVar2 = uv_fs_symlink((uv_loop_t *)0x0,req_00,"test_file_symlink2","test_file_symlink2_symlink",
                          0,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00153e41;
    puVar4 = (uv_loop_t *)auStack_798;
    pcStackY_7b8 = (code *)0x153cbd;
    uv_fs_req_cleanup((uv_fs_t *)puVar4);
    pcStackY_7b8 = (code *)0x153cda;
    pcVar7 = (char *)loop;
    iVar2 = uv_fs_readlink(loop,(uv_fs_t *)puVar4,"test_file_symlink2_symlink",readlink_cb);
    if (iVar2 != 0) goto LAB_00153e46;
    pcStackY_7b8 = (code *)0x153cf0;
    pcVar7 = (char *)loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (readlink_cb_count != 1) goto LAB_00153e4b;
    pcStackY_7b8 = (code *)0x153d1c;
    pcVar7 = (char *)loop;
    iVar2 = uv_fs_realpath(loop,(uv_fs_t *)auStack_798,"test_file",realpath_cb);
    if (iVar2 != 0) goto LAB_00153e50;
    pcStackY_7b8 = (code *)0x153d32;
    pcVar7 = (char *)loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (realpath_cb_count != 1) goto LAB_00153e55;
    pcStackY_7b8 = (code *)0x153d4d;
    uv_run(loop,UV_RUN_DEFAULT);
    pcStackY_7b8 = (code *)0x153d59;
    unlink("test_file");
    pcStackY_7b8 = (code *)0x153d65;
    unlink("test_file_symlink");
    pcStackY_7b8 = (code *)0x153d71;
    unlink("test_file_symlink_symlink");
    pcStackY_7b8 = (code *)0x153d7d;
    unlink("test_file_symlink2");
    pcStackY_7b8 = (code *)0x153d89;
    unlink("test_file_symlink2_symlink");
    pcStackY_7b8 = (code *)0x153d8e;
    puVar4 = uv_default_loop();
    pcStackY_7b8 = (code *)0x153da2;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    pcStackY_7b8 = (code *)0x153dac;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pcStackY_7b8 = (code *)0x153db1;
    pcVar7 = (char *)uv_default_loop();
    pcStackY_7b8 = (code *)0x153db9;
    iVar2 = uv_loop_close((uv_loop_t *)pcVar7);
    if (iVar2 == 0) {
      return 0;
    }
  }
  pcStackY_7b8 = symlink_cb;
  run_test_fs_symlink_cold_29();
  if (((uv_loop_t *)pcVar7)->backend_fd == 0x18) {
    if (((uv_loop_t *)pcVar7)->watcher_queue[0] == (void *)0x0) {
      symlink_cb_count = symlink_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)pcVar7);
      return extraout_EAX;
    }
  }
  else {
    puStackY_7c0 = (uv_loop_t *)0x153e7e;
    symlink_cb_cold_1();
  }
  puStackY_7c0 = (uv_loop_t *)readlink_cb;
  symlink_cb_cold_2();
  puVar6 = (uv_loop_t *)pcVar7;
  puStackY_7c0 = puVar4;
  if (((uv_loop_t *)pcVar7)->backend_fd == 0x19) {
    if (((uv_loop_t *)pcVar7)->watcher_queue[0] != (void *)0x0) goto LAB_00153ebc;
    puVar6 = (uv_loop_t *)((uv_loop_t *)pcVar7)->watcher_queue[1];
    puStackY_7c8 = (uv_fs_t *)0x153ea4;
    iVar2 = strcmp((char *)puVar6,"test_file_symlink2");
    if (iVar2 == 0) {
      readlink_cb_count = readlink_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)pcVar7);
      return extraout_EAX_00;
    }
  }
  else {
    puStackY_7c8 = (uv_fs_t *)0x153ebc;
    readlink_cb_cold_1();
    pcVar7 = (char *)puVar4;
LAB_00153ebc:
    puStackY_7c8 = (uv_fs_t *)0x153ec1;
    readlink_cb_cold_2();
  }
  puStackY_7c8 = (uv_fs_t *)realpath_cb;
  readlink_cb_cold_3();
  sStackY_be0 = 0x400;
  puVar4 = puVar6;
  puStackY_7d0 = (uv_loop_t *)pcVar7;
  puStackY_7c8 = req_00;
  if (puVar6->backend_fd == 0x1c) {
    if (puVar6->watcher_queue[0] == (void *)0x0) {
      uv_cwd(acStackY_bd8,&sStackY_be0);
      sVar5 = strlen(acStackY_bd8);
      builtin_strncpy(acStackY_bd8 + sVar5,"/test_fi",8);
      *(undefined4 *)((long)auStackY_bd1 + sVar5) = 0x656c69;
      pcVar7 = (char *)puVar6->watcher_queue[1];
      iVar3 = strcmp(pcVar7,acStackY_bd8);
      iVar2 = (int)pcVar7;
      if (iVar3 == 0) {
        realpath_cb_count = realpath_cb_count + 1;
        uv_fs_req_cleanup((uv_fs_t *)puVar6);
        return extraout_EAX_01;
      }
      goto LAB_00153f4d;
    }
  }
  else {
    realpath_cb_cold_1();
    puVar6 = (uv_loop_t *)pcVar7;
  }
  iVar2 = (int)puVar4;
  realpath_cb_cold_2();
LAB_00153f4d:
  realpath_cb_cold_3();
  puStackY_c18 = puVar6;
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");
  rmdir("test_dir_symlink");
  asStackY_de8[0] = 0x400;
  loop = uv_default_loop();
  iVar8 = 0;
  uv_fs_mkdir((uv_loop_t *)0x0,&uStackY_dd0,"test_dir",0x1ff,(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&uStackY_dd0);
  uv_cwd(test_symlink_dir_impl::test_dir_abs_buf,asStackY_de8);
  sVar5 = strlen(test_symlink_dir_impl::test_dir_abs_buf);
  builtin_strncpy(test_symlink_dir_impl::test_dir_abs_buf + sVar5,"/test_di",8);
  (test_symlink_dir_impl::test_dir_abs_buf + sVar5 + 8)[0] = 'r';
  (test_symlink_dir_impl::test_dir_abs_buf + sVar5 + 8)[1] = '\0';
  asStackY_de8[0] = asStackY_de8[0] + 9;
  iVar3 = uv_fs_symlink((uv_loop_t *)0x0,&uStackY_dd0,"test_dir","test_dir_symlink",iVar2,
                        (uv_fs_cb)0x0);
  if ((iVar2 == 1) && ((iVar3 == -1 || (iVar3 == -0x5f)))) {
    test_symlink_dir_impl_cold_1();
    iVar8 = 1;
  }
  else {
    test_symlink_dir_impl_cold_2();
  }
  return iVar8;
}

Assistant:

TEST_IMPL(fs_realpath) {
  uv_fs_t req;

  loop = uv_default_loop();
  ASSERT(0 == uv_fs_realpath(loop, &req, "no_such_file", dummy_cb));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(dummy_cb_count == 1);
  ASSERT(req.ptr == NULL);
#ifdef _WIN32
  /*
   * Windows XP and Server 2003 don't support GetFinalPathNameByHandleW()
   */
  if (req.result == UV_ENOSYS) {
    uv_fs_req_cleanup(&req);
    RETURN_SKIP("realpath is not supported on Windows XP");
  }
#endif
  ASSERT(req.result == UV_ENOENT);
  uv_fs_req_cleanup(&req);

  ASSERT(UV_ENOENT == uv_fs_realpath(NULL, &req, "no_such_file", NULL));
  ASSERT(req.ptr == NULL);
  ASSERT(req.result == UV_ENOENT);
  uv_fs_req_cleanup(&req);

  MAKE_VALGRIND_HAPPY();
  return 0;
}